

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirEMPTYTRD(void)

{
  bool bVar1;
  ulong uVar2;
  void *__src;
  unsigned_long *puVar3;
  unsigned_long local_80 [2];
  undefined1 local_70 [8];
  string srcLabel;
  undefined1 local_40 [8];
  path fnaam;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char diskLabel [9];
  
  if (pass == 3) {
    fnaam._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._7_1_
         = ' ';
    cStack_10 = ' ';
    cStack_f = ' ';
    cStack_e = ' ';
    cStack_d = ' ';
    cStack_c = ' ';
    cStack_b = ' ';
    cStack_a = ' ';
    GetOutputFileName_abi_cxx11_((path *)local_40,&lp);
    uVar2 = std::filesystem::__cxx11::path::has_filename();
    if ((uVar2 & 1) == 0) {
      Error("[EMPTYTRD] Syntax error",bp,IF_FIRST);
      srcLabel.field_2._8_4_ = 1;
    }
    else {
      bVar1 = anyComma(&lp);
      if (bVar1) {
        GetDelimitedString_abi_cxx11_((string *)local_70,&lp);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          __src = (void *)std::__cxx11::string::data();
          local_80[1] = 8;
          local_80[0] = std::__cxx11::string::size();
          puVar3 = std::min<unsigned_long>(local_80 + 1,local_80);
          memcpy((void *)((long)&fnaam._M_cmpts._M_impl._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         + 7),__src,*puVar3);
          uVar2 = std::__cxx11::string::size();
          if (8 < uVar2) {
            Warning("[EMPTYTRD] label will be truncated to 8 characters",
                    (char *)((long)&fnaam._M_cmpts._M_impl._M_t.
                                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            + 7),W_PASS3);
          }
        }
        else {
          Error("[EMPTYTRD] Syntax error, empty label",bp,IF_FIRST);
        }
        std::__cxx11::string::~string((string *)local_70);
      }
      TRD_SaveEmpty((path *)local_40,
                    (char *)((long)&fnaam._M_cmpts._M_impl._M_t.
                                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            + 7));
      srcLabel.field_2._8_4_ = 0;
    }
    std::filesystem::__cxx11::path::~path((path *)local_40);
  }
  else {
    SkipToEol(&lp);
  }
  return;
}

Assistant:

static void dirEMPTYTRD() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	char diskLabel[9] = "        ";

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[EMPTYTRD] Syntax error", bp, IF_FIRST);
		return;
	}
	if (anyComma(lp)) {
		const std::string srcLabel = GetDelimitedString(lp);
		if (srcLabel.empty()) {
			Error("[EMPTYTRD] Syntax error, empty label", bp, IF_FIRST);
		} else {
			memcpy(diskLabel, srcLabel.data(), std::min(static_cast<std::string::size_type>(8), srcLabel.size()));
			if (8 < srcLabel.size()) {
				Warning("[EMPTYTRD] label will be truncated to 8 characters", diskLabel);
			}
		}
	}
	TRD_SaveEmpty(fnaam, diskLabel);
}